

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllContentModel.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::AllContentModel::validateContentSpecial
          (AllContentModel *this,QName **children,XMLSize_t childCount,uint param_3,
          GrammarResolver *pGrammarResolver,XMLStringPool *pStringPool,XMLSize_t *indexFailingChild,
          MemoryManager *manager)

{
  QName *anElement;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar3;
  undefined4 in_register_0000000c;
  size_t sVar4;
  ulong uVar5;
  size_t __n;
  bool bVar6;
  SubstitutionGroupComparator comparator;
  ulong local_68;
  SubstitutionGroupComparator local_40;
  void *__s;
  
  if (childCount == 0) {
    uVar3 = this->fNumRequired;
    if (uVar3 == 0 || this->fHasOptionalContent != false) {
      return true;
    }
    local_68 = 0;
  }
  else {
    local_40.fGrammarResolver = pGrammarResolver;
    local_40.fStringPool = pStringPool;
    iVar2 = (*manager->_vptr_MemoryManager[3])
                      (manager,this->fCount,childCount,CONCAT44(in_register_0000000c,param_3));
    __s = (void *)CONCAT44(extraout_var,iVar2);
    __n = this->fCount;
    if (__n != 0) {
      memset(__s,0,__n);
    }
    bVar6 = true;
    local_68 = 0;
    uVar5 = 0;
    do {
      anElement = children[uVar5];
      if ((this->fIsMixed != true) || (anElement->fURIId != 0xffffffff)) {
        sVar4 = 0;
        if (__n != 0) {
          do {
            bVar1 = SubstitutionGroupComparator::isEquivalentTo
                              (&local_40,anElement,this->fChildren[sVar4]);
            if (bVar1) {
              if (*(char *)((long)__s + sVar4) == '\x01') {
                *indexFailingChild = uVar5;
                goto LAB_002e44c5;
              }
              *(undefined1 *)((long)__s + sVar4) = 1;
              __n = this->fCount;
              local_68 = local_68 + ((ulong)this->fChildOptional[sVar4] ^ 1);
              break;
            }
            sVar4 = sVar4 + 1;
            __n = this->fCount;
          } while (sVar4 < __n);
        }
        if (sVar4 == __n) {
          *indexFailingChild = uVar5;
          goto LAB_002e44bb;
        }
      }
      uVar5 = uVar5 + 1;
      bVar6 = uVar5 < childCount;
    } while (uVar5 != childCount);
    bVar6 = false;
LAB_002e44bb:
    if (__s != (void *)0x0) {
LAB_002e44c5:
      (*manager->_vptr_MemoryManager[4])();
    }
    if (bVar6) {
      return false;
    }
    uVar3 = this->fNumRequired;
  }
  if (local_68 != uVar3) {
    *indexFailingChild = childCount;
    return false;
  }
  return true;
}

Assistant:

bool AllContentModel::validateContentSpecial(QName** const          children
                                          , XMLSize_t               childCount
                                          , unsigned int
                                          , GrammarResolver*  const pGrammarResolver
                                          , XMLStringPool*    const pStringPool
                                          , XMLSize_t*              indexFailingChild
                                          , MemoryManager*    const manager) const
{
    // If <all> had minOccurs of zero and there are
    // no children to validate, trivially validate
    if (childCount == 0 && (fHasOptionalContent || !fNumRequired))
        return true;

    // keep track of the required element seen
    XMLSize_t numRequiredSeen = 0;

    if(childCount > 0)
    {
        SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

        // Check for duplicate element
        bool* elementSeen = (bool*) manager->allocate(fCount*sizeof(bool)); //new bool[fCount];

        const ArrayJanitor<bool> jan(elementSeen, manager);

        // initialize the array
        for (XMLSize_t i = 0; i < fCount; i++)
            elementSeen[i] = false;

        for (XMLSize_t outIndex = 0; outIndex < childCount; outIndex++) {
            // Get the current child out of the source index
            QName* const curChild = children[outIndex];

            // If it's PCDATA, then we just accept that
            if (fIsMixed && curChild->getURI() == XMLElementDecl::fgPCDataElemId)
                continue;

            // And try to find it in our list
            XMLSize_t inIndex = 0;
            for (; inIndex < fCount; inIndex++)
            {
                QName* const inChild = fChildren[inIndex];
                if ( comparator.isEquivalentTo(curChild, inChild)) {
                    // match
                    // If this element was seen already, indicate an error was
                    // found at the duplicate index.
                    if (elementSeen[inIndex]) {
                        *indexFailingChild=outIndex;
                        return false;
                    }
                    else
                        elementSeen[inIndex] = true;

                    if (!fChildOptional[inIndex])
                        numRequiredSeen++;

                    break;
                }
            }

            // We did not find this one, so the validation failed
            if (inIndex == fCount) {
                *indexFailingChild=outIndex;
                return false;
            }

        }
    }

    // Were all the required elements of the <all> encountered?
    if (numRequiredSeen != fNumRequired) {
        *indexFailingChild=childCount;
        return false;
    }

    // Everything seems to be ok, so return success
    return true;

}